

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O1

void Assimp::LogFunctions<Assimp::IFCImporter>::LogError(format *message)

{
  bool bVar1;
  Logger *this;
  long *plVar2;
  long *plVar3;
  long *local_58;
  long local_48;
  long lStack_40;
  long *local_38 [2];
  long local_28 [2];
  
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    this = DefaultLogger::get();
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x772210);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = plVar2[3];
      local_58 = &local_48;
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    Logger::error(this,(char *)local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return;
}

Assistant:

static void LogError(const Formatter::format& message)  {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_ERROR(Prefix()+(std::string)message);
        }
    }